

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedSSOAtomicCounters::Cleanup(AdvancedSSOAtomicCounters *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vbo);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_counter_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_transform_buffer);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&this->m_buffer_tex);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_vsp);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_fsp);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,&this->m_pipeline);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteBuffers(1, &m_buffer);
		glDeleteBuffers(1, &m_vbo);
		glDeleteBuffers(1, &m_counter_buffer);
		glDeleteBuffers(1, &m_transform_buffer);
		glDeleteTextures(1, &m_buffer_tex);
		glDeleteProgram(m_vsp);
		glDeleteProgram(m_fsp);
		glDeleteVertexArrays(1, &m_vao);
		glDeleteProgramPipelines(1, &m_pipeline);
		return NO_ERROR;
	}